

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Id __thiscall dxil_spv::Converter::Impl::build_offset(Impl *this,Id value,uint offset)

{
  Id IVar1;
  Builder *this_00;
  Operation *this_01;
  Id local_48;
  Id local_44;
  initializer_list<unsigned_int> local_40;
  
  if (offset != 0) {
    this_00 = SPIRVModule::get_builder(this->spirv_module);
    IVar1 = spv::Builder::makeIntegerType(this_00,0x20,false);
    this_01 = allocate(this,OpIAdd,IVar1);
    local_48 = value;
    IVar1 = spv::Builder::makeIntegerType(this_00,0x20,false);
    local_44 = spv::Builder::makeIntConstant(this_00,IVar1,offset,false);
    local_40._M_len = 2;
    local_40._M_array = &local_48;
    Operation::add_ids(this_01,&local_40);
    add(this,this_01,false);
    value = this_01->id;
  }
  return value;
}

Assistant:

spv::Id Converter::Impl::build_offset(spv::Id value, unsigned offset)
{
	if (offset == 0)
		return value;

	auto &builder = spirv_module.get_builder();

	Operation *op = allocate(spv::OpIAdd, builder.makeUintType(32));
	op->add_ids({ value, builder.makeUintConstant(offset) });

	add(op);
	return op->id;
}